

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O1

int ssl_parse_alpn_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  char **ppcVar1;
  char *__s;
  int iVar2;
  byte *pbVar3;
  size_t sVar4;
  ulong uVar5;
  uchar message;
  char **ppcVar6;
  byte *pbVar7;
  
  ppcVar6 = ssl->conf->alpn_list;
  iVar2 = 0;
  if (ppcVar6 != (char **)0x0) {
    if ((len < 4) || ((ulong)(ushort)(*(ushort *)buf << 8 | *(ushort *)buf >> 8) != len - 2)) {
LAB_0011ac4d:
      message = '2';
    }
    else {
      pbVar7 = buf + len;
      pbVar3 = buf + 2;
      do {
        uVar5 = (ulong)*pbVar3;
        if ((ulong)((long)pbVar7 - (long)(pbVar3 + 1)) < uVar5) goto LAB_0011ac4d;
        if (uVar5 == 0) {
          message = '/';
          goto LAB_0011ac5a;
        }
        pbVar3 = pbVar3 + 1 + uVar5;
      } while (pbVar3 != pbVar7);
      __s = *ppcVar6;
      while (__s != (char *)0x0) {
        sVar4 = strlen(__s);
        pbVar3 = buf + 2;
        do {
          uVar5 = (ulong)*pbVar3;
          if ((sVar4 == uVar5) && (iVar2 = bcmp(pbVar3 + 1,__s,uVar5), iVar2 == 0)) {
            ssl->alpn_chosen = __s;
            return 0;
          }
          pbVar3 = pbVar3 + 1 + uVar5;
        } while (pbVar3 != pbVar7);
        ppcVar1 = ppcVar6 + 1;
        ppcVar6 = ppcVar6 + 1;
        __s = *ppcVar1;
      }
      message = 'x';
    }
LAB_0011ac5a:
    mbedtls_ssl_send_alert_message(ssl,'\x02',message);
    iVar2 = -0x7900;
  }
  return iVar2;
}

Assistant:

static int ssl_parse_alpn_ext( mbedtls_ssl_context *ssl,
                               const unsigned char *buf, size_t len )
{
    size_t list_len, name_len;
    const char **p;

    /* If we didn't send it, the server shouldn't send it */
    if( ssl->conf->alpn_list == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "non-matching ALPN extension" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_HANDSHAKE_FAILURE );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    /*
     * opaque ProtocolName<1..2^8-1>;
     *
     * struct {
     *     ProtocolName protocol_name_list<2..2^16-1>
     * } ProtocolNameList;
     *
     * the "ProtocolNameList" MUST contain exactly one "ProtocolName"
     */

    /* Min length is 2 (list_len) + 1 (name_len) + 1 (name) */
    if( len < 4 )
    {
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    list_len = ( buf[0] << 8 ) | buf[1];
    if( list_len != len - 2 )
    {
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    name_len = buf[2];
    if( name_len != list_len - 1 )
    {
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    /* Check that the server chosen protocol was in our list and save it */
    for( p = ssl->conf->alpn_list; *p != NULL; p++ )
    {
        if( name_len == strlen( *p ) &&
            memcmp( buf + 3, *p, name_len ) == 0 )
        {
            ssl->alpn_chosen = *p;
            return( 0 );
        }
    }

    MBEDTLS_SSL_DEBUG_MSG( 1, ( "ALPN extension: no matching protocol" ) );
    mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                    MBEDTLS_SSL_ALERT_MSG_HANDSHAKE_FAILURE );
    return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
}